

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O0

token * __thiscall argo::pointer::make_token(token *__return_storage_ptr__,pointer *this,string *s)

{
  bool bVar1;
  long *plVar2;
  size_t local_1a8;
  size_t i;
  istringstream is;
  string *s_local;
  pointer *this_local;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&i,s,8);
  plVar2 = (long *)std::istream::operator>>((istringstream *)&i,&local_1a8);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if (bVar1) {
    token::token(__return_storage_ptr__,local_1a8);
  }
  else {
    token::token(__return_storage_ptr__,s);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

pointer::token pointer::make_token(const string &s)
{
    istringstream is(s);

    size_t i;

    if (is >> i)
    {
        return token(i);
    }
    else
    {
        return token(s);
    }
}